

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall
pbrt::syntactic::LightSource::LightSource
          (LightSource *this,string *type,Transform *transform,SP *attributes)

{
  Node *in_RCX;
  void *in_RDX;
  shared_ptr<pbrt::syntactic::Attributes> *in_RDI;
  shared_ptr<pbrt::syntactic::Attributes> *in_stack_ffffffffffffffc8;
  
  Node::Node(in_RCX,(string *)in_RCX);
  (in_RDI->super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR_toString_abi_cxx11__002229a8;
  memcpy(&in_RDI[5].super___shared_ptr<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount,in_RDX,0x60);
  std::shared_ptr<pbrt::syntactic::Attributes>::shared_ptr(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

LightSource(const std::string &type, 
                  const Transform &transform,
                  Attributes::SP  attributes)
        : Node(type),
          transform(transform),
          attributes(attributes)
      {}